

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O1

int mask_or_r(uint32_t *dmask,uint32_t *smask,int size)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (0 < size) {
    uVar2 = size + 0x1fU >> 5;
    if (uVar2 < 2) {
      uVar2 = 1;
    }
    uVar3 = 0;
    iVar1 = 0;
    do {
      uVar4 = smask[uVar3] | dmask[uVar3];
      if (uVar4 != dmask[uVar3]) {
        iVar1 = 1;
      }
      dmask[uVar3] = uVar4;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    return iVar1;
  }
  return 0;
}

Assistant:

int mask_or_r(uint32_t *dmask, uint32_t *smask, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	int res = 0;
	for (i = 0; i < rsize; i++) {
		uint32_t n = dmask[i] | smask[i];
		if (n != dmask[i])
			res = 1;
		dmask[i] = n;
	}
	return res;
}